

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto,FlatAllocator *alloc)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedField<int> *this_01;
  RepeatedField<int> *this_02;
  Base<google::protobuf::SourceCodeInfo> BVar1;
  Base<google::protobuf::FileDescriptorTables> BVar2;
  pointer pLVar3;
  pointer __n_00;
  pointer __s;
  PointerT<char> pcVar4;
  DescriptorPool *pDVar5;
  pointer __src;
  MethodDescriptor *pMVar6;
  iterator iVar7;
  ctrl_t *pcVar8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  bool bVar9;
  bool bVar10;
  int iVar11;
  Base<google::protobuf::SourceCodeInfo> BVar12;
  Base<google::protobuf::FileDescriptorTables> BVar13;
  int iVar14;
  int iVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  undefined8 *puVar16;
  FeatureSetDefaults *compiled_defaults;
  FeatureResolver *__args;
  Tables *pTVar17;
  DeferredValidation *pDVar18;
  void *pvVar19;
  size_t sVar20;
  long *plVar21;
  const_reference piVar22;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar23;
  InternalMetadata IVar24;
  int *piVar25;
  FileDescriptor *pFVar26;
  Descriptor *pDVar27;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar28
  ;
  EnumDescriptor *pEVar29;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar30;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar31;
  pointer pOVar32;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar33;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *pVVar34;
  Nonnull<const_char_*> pcVar35;
  anon_union_8_1_a8a14541_for_iterator_2 aVar36;
  anon_union_8_1_a8a14541_for_iterator_2 aVar37;
  difference_type __n_1;
  ulong uVar38;
  void *extraout_RDX;
  FileDescriptorProto *proto_00;
  FileDescriptor *result_00;
  size_type __n;
  undefined1 *this_03;
  FileDescriptorTables *pFVar39;
  DescriptorBuilder *pDVar40;
  once_flag *__dest;
  ServiceDescriptor *pSVar41;
  OptionsToInterpret *pOVar42;
  slot_type *psVar43;
  undefined1 *from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  size_t sVar44;
  DescriptorBuilder *pDVar45;
  long lVar46;
  char *pcVar47;
  ErrorLocation location;
  char *error;
  bool bVar48;
  bool bVar49;
  int i_1;
  SourceCodeInfo *pSVar50;
  long lVar51;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar52;
  OptionsToInterpret *pOVar53;
  int i_2;
  long lVar54;
  OptionsToInterpret *pOVar55;
  long in_FS_OFFSET;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view name;
  string_view key_00;
  string_view name_00;
  string_view name_01;
  string_view element_name_03;
  string_view element_name_04;
  iterator iVar56;
  FileDescriptor *result;
  FileDescriptor *dependency;
  FlatAllocator lazy_dep_alloc;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  weak_deps;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  seen_dependencies;
  StatusOr<google::protobuf::FeatureResolver> feature_resolver;
  DescriptorBuilder *local_248;
  slot_type *local_240;
  undefined1 local_231;
  DescriptorBuilder *local_230;
  DescriptorBuilder *local_228;
  DescriptorBuilder *local_220;
  DescriptorBuilder *local_218;
  FileDescriptorProto *local_210;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>_>_>::iterator,_bool>
  local_208;
  DescriptorPool *local_1f0;
  DescriptorBuilder *local_1e8;
  undefined1 local_1e0 [16];
  Base<google::protobuf::SourceCodeInfo> local_1d0;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  rStack_1c8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_1a8;
  DynamicMessageFactory local_188 [2];
  SourceCodeInfo *local_100;
  undefined1 *local_f8;
  code *pcStack_f0;
  undefined1 *local_e8;
  code *pcStack_e0;
  undefined1 *local_d8;
  code *pcStack_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  StatusOrData<google::protobuf::FeatureResolver> local_88;
  
  local_240 = (slot_type *)alloc;
  local_248 = (DescriptorBuilder *)
              anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::AllocateArray<google::protobuf::FileDescriptor>
                        (&alloc->
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,(int)proto);
  this->file_ = (FileDescriptor *)local_248;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x20) ==
      (undefined1  [232])0x0) {
    pcVar47 = (char *)((ulong)(proto->field_0)._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    if ((*(long *)(pcVar47 + 8) == 0) ||
       (iVar11 = std::__cxx11::string::compare(pcVar47), iVar11 == 0)) {
      this->file_->edition_ = EDITION_PROTO2;
    }
    else {
      iVar11 = std::__cxx11::string::compare
                         ((char *)((ulong)(proto->field_0)._impl_.syntax_.tagged_ptr_.ptr_ &
                                  0xfffffffffffffffc));
      if (iVar11 == 0) {
        this->file_->edition_ = EDITION_PROTO3;
      }
      else {
        this->file_->edition_ = EDITION_UNKNOWN;
        puVar16 = (undefined8 *)
                  ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        local_d8 = local_1e0;
        local_1e0._0_8_ = proto;
        pcStack_d0 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_._0_4_ = 0x1756c3;
        make_error.ptr_.obj = local_d8;
        make_error.invoker_._4_4_ = 0;
        element_name._M_str = (char *)*puVar16;
        element_name._M_len = puVar16[1];
        AddError(this,element_name,&proto->super_Message,OTHER,make_error);
      }
    }
  }
  else {
    *(int *)&(local_248->feature_resolver_).
             super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
             super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
             super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload =
         (proto->field_0)._impl_.edition_;
  }
  compiled_defaults = DescriptorPool::GetFeatureSetDefaults(this->pool_);
  FeatureResolver::Create
            ((StatusOr<google::protobuf::FeatureResolver> *)&local_88,this->file_->edition_,
             compiled_defaults);
  if (local_88.field_0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1) {
    __args = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::value
                       ((StatusOr<google::protobuf::FeatureResolver> *)&local_88);
    std::optional<google::protobuf::FeatureResolver>::emplace<google::protobuf::FeatureResolver>
              (&this->feature_resolver_,__args);
  }
  else {
    puVar16 = (undefined8 *)
              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    local_e8 = local_1e0;
    local_1e0._0_8_ = &local_88;
    pcStack_e0 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error_00.invoker_._0_4_ = 0x175712;
    make_error_00.ptr_.obj = local_e8;
    make_error_00.invoker_._4_4_ = 0;
    element_name_00._M_str = (char *)*puVar16;
    element_name_00._M_len = puVar16[1];
    AddError(this,element_name_00,&proto->super_Message,EDITIONS,make_error_00);
  }
  *(undefined2 *)((SymbolBase *)&local_248->pool_ + 1) = 0;
  if ((((undefined1  [232])proto->field_0 & (undefined1  [232])0x10) != (undefined1  [232])0x0) &&
     ((proto->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0)) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.source_code_info_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x33e3);
  }
  if (((undefined1  [232])proto->field_0 & (undefined1  [232])0x10) == (undefined1  [232])0x0) {
    this_03 = _SourceCodeInfo_default_instance_;
    pSVar50 = (SourceCodeInfo *)0x0;
  }
  else {
    if ((((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *)&(local_240->value).first)->pointers_).payload_.super_Base<char>.value ==
        (PointerT<char>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b0,"has_allocated()");
      goto LAB_00160996;
    }
    pLVar3 = (local_240->value).second.
             super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    BVar1.value = *(IntT<google::protobuf::SourceCodeInfo> *)((long)local_240 + 0xb0);
    BVar12.value = BVar1.value + 1;
    *(IntT<google::protobuf::SourceCodeInfo> *)((long)local_240 + 0xb0) = BVar12.value;
    if (*(IntT<google::protobuf::SourceCodeInfo> *)((long)local_240 + 0x78) < BVar12.value) {
      pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)BVar12.value,
                           (long)*(IntT<google::protobuf::SourceCodeInfo> *)((long)local_240 + 0x78)
                           ,"used <= total_.template Get<TypeToUse>()");
    }
    else {
      pcVar35 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar35 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b6,pcVar35);
      goto LAB_00160996;
    }
    this_03 = (undefined1 *)((long)pLVar3 + (long)BVar1.value * 0x48);
    from = (undefined1 *)(proto->field_0)._impl_.source_code_info_;
    if ((SourceCodeInfo *)from == (SourceCodeInfo *)0x0) {
      from = _SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom((SourceCodeInfo *)this_03,(SourceCodeInfo *)from);
    pSVar50 = (SourceCodeInfo *)this_03;
  }
  (local_248->filename_)._M_string_length = (size_type)this_03;
  if ((((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
         *)&(local_240->value).first)->pointers_).payload_.super_Base<char>.value ==
      (PointerT<char>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b0,"has_allocated()");
    goto LAB_00160996;
  }
  pLVar3 = (local_240->value).second.
           super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  BVar2.value = *(IntT<google::protobuf::FileDescriptorTables> *)((long)local_240 + 0xb4);
  BVar13.value = BVar2.value + 1;
  *(IntT<google::protobuf::FileDescriptorTables> *)((long)local_240 + 0xb4) = BVar13.value;
  if (*(IntT<google::protobuf::FileDescriptorTables> *)((long)local_240 + 0x7c) < BVar13.value) {
    pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((long)BVar13.value,
                         (long)*(IntT<google::protobuf::FileDescriptorTables> *)
                                ((long)local_240 + 0x7c),"used <= total_.template Get<TypeToUse>()")
    ;
  }
  else {
    pcVar35 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar35 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b6,pcVar35);
    goto LAB_00160996;
  }
  pFVar39 = (FileDescriptorTables *)((long)pLVar3 + (long)BVar2.value * 200);
  this->file_tables_ = pFVar39;
  this->file_->tables_ = pFVar39;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x1) ==
      (undefined1  [232])0x0) {
    AddError(this,(string_view)(ZEXT816(0x3ae715) << 0x40),&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
  }
  in = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  pTVar17 = (Tables *)
            (anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateStrings<std::__cxx11::string_const&>
                      ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)&local_240->value,in);
  local_248->tables_ = pTVar17;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x2) ==
      (undefined1  [232])0x0) {
    pDVar18 = (DeferredValidation *)
              (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<char_const(&)[1]>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)&local_240->value,(char (*) [1])in);
  }
  else {
    pDVar18 = (DeferredValidation *)
              (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<std::__cxx11::string_const&>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)&local_240->value,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(proto->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
  }
  pDVar40 = local_248;
  local_248->deferred_validation_ = pDVar18;
  local_248->error_collector_ = (ErrorCollector *)this->pool_;
  __n_00 = (local_248->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__n_00 == (pointer)0x0) {
LAB_0015f0c5:
    bVar9 = DescriptorPool::Tables::AddFile(this->tables_,(FileDescriptor *)pDVar40);
    if (bVar9) {
      sVar44 = *(size_t *)(local_248->deferred_validation_->initial_buffer_ + 8);
      if (sVar44 != 0) {
        pcVar47 = *(char **)local_248->deferred_validation_->initial_buffer_;
        sVar20 = 0;
        uVar38 = 0;
        do {
          uVar38 = uVar38 + (pcVar47[sVar20] == '.');
          sVar20 = sVar20 + 1;
        } while (sVar44 != sVar20);
        if (100 < uVar38) {
          error = "Exceeds Maximum Package Depth";
          location = NAME;
          goto LAB_0015f143;
        }
        name._M_str = pcVar47;
        name._M_len = sVar44;
        AddPackage(this,name,&proto->super_Message,(FileDescriptor *)local_248,true);
      }
      local_a8._0_8_ = (_func_int **)0x1;
      local_a8._8_8_ = 0;
      iVar11 = *(int *)((long)&proto->field_0 + 0x10);
      *(int *)((long)&(local_248->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload +
              0x10) = iVar11;
      pcVar4 = (((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  *)&(local_240->value).first)->pointers_).payload_.super_Base<char>.value;
      if (pcVar4 == (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b0,"has_allocated()");
LAB_00160996:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_1e0);
      }
      iVar14 = *(int *)((long)local_240 + 0xa8);
      iVar11 = iVar14 + iVar11 * 8;
      *(int *)((long)local_240 + 0xa8) = iVar11;
      if (*(int *)((long)local_240 + 0x70) < iVar11) {
        pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar11,(long)*(int *)((long)local_240 + 0x70),
                             "used <= total_.template Get<TypeToUse>()");
      }
      else {
        pcVar35 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar35 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b6,pcVar35);
        goto LAB_00160996;
      }
      *(PointerT<char> *)
       ((long)&(local_248->feature_resolver_).
               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
               super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
               defaults_ + 0x28) = pcVar4 + iVar14;
      ((InternalMetadata *)
      ((long)&(local_248->feature_resolver_).
              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value.
              defaults_ + 8))->ptr_ = 0;
      local_1e8 = (DescriptorBuilder *)&this->unused_dependency_;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)local_1e8);
      local_220 = (DescriptorBuilder *)&this->tables_;
      local_c8._0_8_ = (DescriptorPool *)0x1;
      local_c8._8_8_ = (Tables *)0x0;
      this_01 = &(proto->field_0)._impl_.weak_dependency_;
      local_100 = pSVar50;
      for (iVar11 = 0;
          iVar14 = internal::SooRep::size
                             (&this_01->soo_rep_,
                              (undefined1  [16])
                              ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4
                              ) == (undefined1  [16])0x0), iVar11 < iVar14; iVar11 = iVar11 + 1) {
        piVar22 = RepeatedField<int>::Get(this_01,iVar11);
        local_218 = (DescriptorBuilder *)CONCAT44(local_218._4_4_,*piVar22);
        local_208.first.ctrl_ = (ctrl_t *)local_c8;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                    *)local_1e0,&local_208,(int *)&local_218,(int *)&local_218);
      }
      local_230 = (DescriptorBuilder *)((ulong)local_230 & 0xffffffff00000000);
      iVar14 = 0;
      iVar11 = *(int *)((long)&proto->field_0 + 0x10);
      bVar9 = 0 < iVar11;
      if (iVar11 < 1) {
        bVar49 = false;
      }
      else {
        local_228 = (DescriptorBuilder *)&(proto->field_0)._impl_.dependency_;
        bVar48 = false;
        do {
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              ((RepeatedPtrFieldBase *)local_228,iVar14);
          local_208.first.ctrl_ = local_a8;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                      *)local_1e0,&local_208,pVVar23,pVVar23);
          if (local_1d0.value._0_1_ == false) {
            AddTwiceListedError(this,proto,(int)local_230);
          }
          pTVar17 = *(Tables **)&local_220->pool_;
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                              ((RepeatedPtrFieldBase *)local_228,(int)local_230);
          key_00._M_str = (pVVar23->_M_dataplus)._M_p;
          key_00._M_len = pVVar23->_M_string_length;
          local_218 = (DescriptorBuilder *)DescriptorPool::Tables::FindFile(pTVar17,key_00);
          if ((local_218 == (DescriptorBuilder *)0x0) &&
             (pDVar5 = this->pool_->underlay_, pDVar5 != (DescriptorPool *)0x0)) {
            pVVar23 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                ((RepeatedPtrFieldBase *)local_228,(int)local_230);
            name_00._M_str = (pVVar23->_M_dataplus)._M_p;
            name_00._M_len = pVVar23->_M_string_length;
            local_218 = (DescriptorBuilder *)DescriptorPool::FindFileByName(pDVar5,name_00);
          }
          pDVar45 = local_218;
          pDVar40 = local_248;
          bVar49 = bVar48;
          if (local_218 != local_248) {
            pDVar5 = this->pool_;
            if (local_218 == (DescriptorBuilder *)0x0) {
              if (pDVar5->lazily_build_dependencies_ == false) {
                if (pDVar5->allow_unknown_ == false) {
                  if (pDVar5->enforce_weak_ == false) {
                    iVar56 = absl::lts_20250127::container_internal::
                             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                             ::find<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                          *)local_c8,(key_arg<int> *)&local_230);
                    absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                    ::AssertNotDebugCapacity
                              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                *)local_c8);
                    if (iVar56.ctrl_ != (ctrl_t *)0x0) goto LAB_0015f461;
                  }
                  AddImportError(this,proto,(int)local_230);
                }
                else {
LAB_0015f461:
                  iVar11 = 0;
                  memset((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          *)local_1e0,0,0xe0);
                  anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::PlanArray<google::protobuf::FileDescriptor>
                            ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                              *)local_1e0,iVar11);
                  (anonymous_namespace)::
                  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  ::PlanArray<std::__cxx11::string>
                            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                              *)local_1e0,1);
                  (anonymous_namespace)::
                  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                              *)local_1e0,(Tables **)local_220);
                  local_1f0 = this->pool_;
                  pVVar23 = internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                      ((RepeatedPtrFieldBase *)local_228,(int)local_230);
                  name_01._M_str = (pVVar23->_M_dataplus)._M_p;
                  name_01._M_len = pVVar23->_M_string_length;
                  local_218 = (DescriptorBuilder *)
                              DescriptorPool::NewPlaceholderFileWithMutexHeld
                                        (local_1f0,name_01,(FlatAllocator *)local_1e0);
                }
              }
            }
            else if (pDVar5->enforce_dependencies_ == true) {
              local_1e0 = (undefined1  [16])
                          absl::lts_20250127::container_internal::
                          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                          ::find<std::__cxx11::string>
                                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                                      *)&pDVar5->direct_input_files_,
                                     (key_arg<std::__cxx11::basic_string<char>_> *)
                                     ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                          *)&this->pool_->direct_input_files_);
              local_208.first.ctrl_ = (ctrl_t *)0x0;
              bVar10 = absl::lts_20250127::container_internal::operator==
                                 ((iterator *)local_1e0,(iterator *)&local_208);
              if ((!bVar10) &&
                 (*(int *)((long)&(local_218->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x14) == 0)) {
                local_208.first.ctrl_ = (ctrl_t *)local_1e8;
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                ::EmplaceDecomposable::operator()
                          ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                            *)local_1e0,&local_208,(FileDescriptor **)&local_218,
                           (FileDescriptor **)&local_218);
              }
            }
            (*(FileDescriptor ***)
              ((long)&(local_248->feature_resolver_).
                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                      _M_value.defaults_ + 0x28))[(int)local_230] = (FileDescriptor *)local_218;
            if (local_218 == (DescriptorBuilder *)0x0) {
              bVar49 = true;
            }
            if (this->pool_->lazily_build_dependencies_ == false) {
              bVar49 = bVar48;
            }
          }
          if (pDVar45 == pDVar40) break;
          iVar14 = (int)local_230 + 1;
          local_230 = (DescriptorBuilder *)CONCAT44(local_230._4_4_,iVar14);
          iVar11 = *(int *)((long)&proto->field_0 + 0x10);
          bVar9 = iVar14 < iVar11;
          bVar48 = bVar49;
        } while (iVar14 < iVar11);
      }
      if (bVar9) {
LAB_00160893:
        pDVar40 = (DescriptorBuilder *)0x0;
      }
      else {
        if (bVar49) {
          if (*(int *)((long)&proto->field_0 + 0x10) < 1) {
            iVar11 = 4;
          }
          else {
            lVar51 = 0;
            iVar14 = 0;
            do {
              iVar11 = iVar14;
              if ((*(FileDescriptor ***)
                    ((long)&(local_248->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload._M_value.defaults_ + 0x28))[lVar51] == (FileDescriptor *)0x0)
              {
                pVVar23 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&(proto->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase
                                     ,(int)lVar51);
                iVar11 = iVar14 + (int)pVVar23->_M_string_length;
              }
              iVar14 = iVar11 + 1;
              lVar51 = lVar51 + 1;
            } while (lVar51 < *(int *)((long)&proto->field_0 + 0x10));
            iVar11 = iVar11 + 5;
          }
          IVar24.ptr_ = (intptr_t)
                        DescriptorPool::Tables::AllocateBytes(*(Tables **)&local_220->pool_,iVar11);
          *(__int_type_conflict1 *)IVar24.ptr_ = 0;
          ((InternalMetadata *)
          ((long)&(local_248->feature_resolver_).
                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                  super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload.
                  _M_value.defaults_ + 8))->ptr_ = IVar24.ptr_;
          if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
            __dest = (once_flag *)(IVar24.ptr_ + 4);
            this_00 = &(proto->field_0)._impl_.dependency_;
            lVar51 = 0;
            do {
              if ((*(FileDescriptor ***)
                    ((long)&(local_248->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload._M_value.defaults_ + 0x28))[lVar51] == (FileDescriptor *)0x0)
              {
                iVar11 = (int)lVar51;
                pVVar23 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar11);
                __src = (pVVar23->_M_dataplus)._M_p;
                pVVar23 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar11);
                memcpy(__dest,__src,pVVar23->_M_string_length);
                pVVar23 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                    (&this_00->super_RepeatedPtrFieldBase,iVar11);
                __dest = (once_flag *)
                         ((long)&(__dest->control_).super___atomic_base<unsigned_int>._M_i +
                         pVVar23->_M_string_length);
              }
              *(undefined1 *)&(__dest->control_).super___atomic_base<unsigned_int>._M_i = 0;
              __dest = (once_flag *)
                       ((long)&(__dest->control_).super___atomic_base<unsigned_int>._M_i + 1);
              lVar51 = lVar51 + 1;
            } while (lVar51 < *(int *)((long)&proto->field_0 + 0x10));
          }
        }
        this_02 = &(proto->field_0)._impl_.public_dependency_;
        iVar11 = internal::SooRep::size
                           (&this_02->soo_rep_,(*(byte *)((long)&proto->field_0 + 0x80) & 4) == 0);
        piVar25 = anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::AllocateArray<int>
                            ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                              *)&local_240->value,iVar11);
        *(int **)((long)&(local_248->feature_resolver_).
                         super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                         _M_payload.
                         super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                         .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                         ._M_value.defaults_ + 0x30) = piVar25;
        iVar11 = 0;
        for (iVar14 = 0;
            iVar15 = internal::SooRep::size
                               (&this_02->soo_rep_,
                                (undefined1  [16])
                                ((undefined1  [16])(this_02->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0), iVar14 < iVar15;
            iVar14 = iVar14 + 1) {
          piVar22 = RepeatedField<int>::Get(this_02,iVar14);
          iVar15 = *piVar22;
          if ((iVar15 < 0) || (*(int *)((long)&proto->field_0 + 0x10) <= iVar15)) {
            puVar16 = (undefined8 *)
                      ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
            element_name_03._M_str = (char *)*puVar16;
            element_name_03._M_len = puVar16[1];
            AddError(this,element_name_03,&proto->super_Message,OTHER,
                     "Invalid public dependency index.");
          }
          else {
            lVar51 = (long)iVar11;
            iVar11 = iVar11 + 1;
            *(int *)(*(long *)((long)&(local_248->feature_resolver_).
                                      super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<google::protobuf::FeatureResolver>
                                      ._M_payload._M_value.defaults_ + 0x30) + lVar51 * 4) = iVar15;
            if (this->pool_->lazily_build_dependencies_ == false) {
              pFVar26 = FileDescriptor::dependency((FileDescriptor *)local_248,iVar15);
              local_1e0._0_8_ = pFVar26;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
              ::erase<google::protobuf::FileDescriptor_const*>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                          *)local_1e8,(key_arg<const_google::protobuf::FileDescriptor_*> *)local_1e0
                        );
            }
          }
        }
        *(int *)((long)&(local_248->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                + 0x14) = iVar11;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::clear(&(this->dependencies_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               );
        if ((this->pool_->lazily_build_dependencies_ == false) &&
           (0 < *(int *)((long)&(local_248->feature_resolver_).
                                super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                ._M_payload.
                                super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                _M_payload + 0x10))) {
          iVar11 = 0;
          do {
            pFVar26 = FileDescriptor::dependency((FileDescriptor *)local_248,iVar11);
            RecordPublicDependencies(this,pFVar26);
            iVar11 = iVar11 + 1;
          } while (iVar11 < *(int *)((long)&(local_248->feature_resolver_).
                                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<google::protobuf::FeatureResolver>
                                            ._M_payload + 0x10));
        }
        iVar11 = internal::SooRep::size
                           (&this_01->soo_rep_,
                            (undefined1  [16])
                            ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4)
                            == (undefined1  [16])0x0);
        piVar25 = anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::AllocateArray<int>
                            ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                              *)&local_240->value,iVar11);
        *(int **)((long)&(local_248->feature_resolver_).
                         super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                         _M_payload.
                         super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                         .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                         ._M_value.defaults_ + 0x38) = piVar25;
        iVar11 = 0;
        for (iVar14 = 0;
            iVar15 = internal::SooRep::size
                               (&this_01->soo_rep_,
                                (undefined1  [16])
                                ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0), iVar14 < iVar15;
            iVar14 = iVar14 + 1) {
          piVar22 = RepeatedField<int>::Get(this_01,iVar14);
          iVar15 = *piVar22;
          if ((iVar15 < 0) || (*(int *)((long)&proto->field_0 + 0x10) <= iVar15)) {
            puVar16 = (undefined8 *)
                      ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
            element_name_04._M_str = (char *)*puVar16;
            element_name_04._M_len = puVar16[1];
            AddError(this,element_name_04,&proto->super_Message,OTHER,
                     "Invalid weak dependency index.");
          }
          else {
            lVar51 = (long)iVar11;
            iVar11 = iVar11 + 1;
            (*(int **)((long)&(local_248->feature_resolver_).
                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                              _M_payload.
                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                              .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                              _M_payload._M_value.defaults_ + 0x38))[lVar51] = iVar15;
          }
        }
        *(int *)((long)&(local_248->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                + 0x18) = iVar11;
        iVar11 = *(int *)((long)&proto->field_0 + 0x28);
        *(int *)((long)&(local_248->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                + 0x1c) = iVar11;
        pDVar27 = anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::AllocateArray<google::protobuf::Descriptor>
                            ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                              *)&local_240->value,iVar11);
        *(Descriptor **)
         ((long)&(local_248->feature_resolver_).
                 super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
                 super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                 super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value
                 .defaults_ + 0x40) = pDVar27;
        if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
          lVar54 = 0;
          lVar51 = 0;
          do {
            pVVar28 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar51);
            BuildMessage(this,pVVar28,(Descriptor *)0x0,
                         (Descriptor *)
                         (&(*(Descriptor **)
                             ((long)&(local_248->feature_resolver_).
                                     super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<google::protobuf::FeatureResolver>
                                     ._M_payload._M_value.defaults_ + 0x40))->super_SymbolBase +
                         lVar54),(FlatAllocator *)&local_240->value);
            lVar51 = lVar51 + 1;
            lVar54 = lVar54 + 0xa0;
          } while (lVar51 < *(int *)((long)&proto->field_0 + 0x28));
        }
        iVar11 = *(int *)((long)&proto->field_0 + 0x40);
        *(int *)((long)&(local_248->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                + 0x20) = iVar11;
        pEVar29 = anon_unknown_24::
                  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  ::AllocateArray<google::protobuf::EnumDescriptor>
                            ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                              *)&local_240->value,iVar11);
        *(EnumDescriptor **)
         ((long)&(local_248->feature_resolver_).
                 super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
                 super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
                 super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload._M_value
                 .defaults_ + 0x48) = pEVar29;
        if (0 < *(int *)((long)&proto->field_0 + 0x40)) {
          lVar54 = 0;
          lVar51 = 0;
          do {
            pVVar30 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar51);
            BuildEnum(this,pVVar30,(Descriptor *)0x0,
                      (EnumDescriptor *)
                      (&(*(EnumDescriptor **)
                          ((long)&(local_248->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload._M_value.defaults_ + 0x48))->super_SymbolBase + lVar54)
                      ,(FlatAllocator *)&local_240->value);
            lVar51 = lVar51 + 1;
            lVar54 = lVar54 + 0x58;
          } while (lVar51 < *(int *)((long)&proto->field_0 + 0x40));
        }
        iVar11 = *(int *)((long)&proto->field_0 + 0x58);
        *(int *)((long)&(local_248->feature_resolver_).
                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                        _M_payload.
                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                        .super__Optional_payload_base<google::protobuf::FeatureResolver>._M_payload
                + 0x24) = iVar11;
        pcVar4 = (((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                    *)&(local_240->value).first)->pointers_).payload_.super_Base<char>.value;
        if (pcVar4 == (PointerT<char>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1b0,"has_allocated()");
          goto LAB_00160996;
        }
        iVar14 = *(int *)((long)local_240 + 0xa8);
        iVar11 = iVar11 * 0x40 + iVar14;
        *(int *)((long)local_240 + 0xa8) = iVar11;
        if (*(int *)((long)local_240 + 0x70) < iVar11) {
          pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((long)iVar11,(long)*(int *)((long)local_240 + 0x70),
                               "used <= total_.template Get<TypeToUse>()");
        }
        else {
          pcVar35 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar35 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_1e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1b6,pcVar35);
          goto LAB_00160996;
        }
        *(ServiceDescriptor **)
         &(local_248->feature_resolver_).
          super__Optional_base<google::protobuf::FeatureResolver,_false,_false>._M_payload.
          super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>.
          super__Optional_payload_base<google::protobuf::FeatureResolver>._M_engaged =
             (ServiceDescriptor *)(pcVar4 + iVar14);
        if (0 < *(int *)((long)&proto->field_0 + 0x58)) {
          lVar54 = 0;
          lVar51 = 0;
          do {
            pVVar31 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                                 (int)lVar51);
            BuildService(this,pVVar31,extraout_RDX,
                         (ServiceDescriptor *)
                         (&(*(ServiceDescriptor **)
                             &(local_248->feature_resolver_).
                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                              _M_payload.
                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                              .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                              _M_engaged)->super_SymbolBase + lVar54),
                         (FlatAllocator *)&local_240->value);
            lVar51 = lVar51 + 1;
            lVar54 = lVar54 + 0x40;
          } while (lVar51 < *(int *)((long)&proto->field_0 + 0x58));
        }
        iVar11 = *(int *)((long)&proto->field_0 + 0x70);
        *(int *)((SymbolBase *)&local_248->pool_ + 4) = iVar11;
        pOVar32 = (pointer)anon_unknown_24::
                           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ::AllocateArray<google::protobuf::FieldDescriptor>
                                     ((FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                       *)&local_240->value,iVar11);
        (local_248->options_to_interpret_).
        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ._M_impl.super__Vector_impl_data._M_start = pOVar32;
        if (0 < *(int *)((long)&proto->field_0 + 0x70)) {
          lVar54 = 0;
          lVar51 = 0;
          do {
            pVVar33 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                 (int)lVar51);
            BuildFieldOrExtension
                      (this,pVVar33,(Descriptor *)0x0,
                       (FieldDescriptor *)
                       ((long)&(((local_248->options_to_interpret_).
                                 super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->name_scope)._M_dataplus
                               ._M_p + lVar54),true,(FlatAllocator *)&local_240->value);
            lVar51 = lVar51 + 1;
            lVar54 = lVar54 + 0x58;
          } while (lVar51 < *(int *)((long)&proto->field_0 + 0x70));
        }
        AllocateOptions(this,proto,(FileDescriptor *)local_248,(FlatAllocator *)&local_240->value);
        CrossLinkFile(this,(FileDescriptor *)local_248,proto);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                    *)&this->message_hints_);
        if (1 < *(size_t *)
                 ((long)&(this->message_hints_).
                         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                         .
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value + 8)) {
          SuggestFieldNumbers(this,(FileDescriptor *)local_248,proto_00);
        }
        if (this->had_errors_ == false) {
          OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_1e0,this);
          pOVar42 = (this->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pOVar42 !=
              (this->options_to_interpret_).
              super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              OptionInterpreter::InterpretOptionsImpl((OptionInterpreter *)local_1e0,pOVar42,true);
              pOVar42 = pOVar42 + 1;
            } while (pOVar42 !=
                     (this->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          pDVar40 = local_248;
          local_231 = *(undefined1 *)(in_FS_OFFSET + -0x60);
          *(undefined1 *)(in_FS_OFFSET + -0x60) = 0;
          local_208.first.field_1.slot_ = local_240;
          local_208.first.ctrl_ = (ctrl_t *)this;
          ResolveFeaturesImpl<google::protobuf::FileDescriptor>
                    (this,*(Edition *)
                           &(local_248->feature_resolver_).
                            super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                            _M_payload.
                            super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                            _M_payload,proto,(FileDescriptor *)local_248,
                     (OptionsType *)
                     (local_248->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(FlatAllocator *)&local_240->value,
                     EDITIONS,true);
          local_228 = pDVar40;
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x1c)) {
            lVar54 = 0;
            lVar51 = 0;
            do {
              lVar46 = *(long *)((long)&(local_228->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x40);
              pVVar28 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                  (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase
                                   ,(int)lVar51);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
              ::Visit<google::protobuf::DescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                          *)&local_208,(Descriptor *)(lVar46 + lVar54),pVVar28);
              lVar51 = lVar51 + 1;
              lVar54 = lVar54 + 0xa0;
            } while (lVar51 < *(int *)((long)&(local_228->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x1c));
          }
          if (0 < *(int *)((long)&(local_228->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x20)) {
            lVar54 = 0;
            lVar51 = 0;
            do {
              lVar46 = *(long *)((long)&(local_228->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x48);
              pVVar30 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                  (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                   (int)lVar51);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
              ::Visit<google::protobuf::EnumDescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                          *)&local_208,(EnumDescriptor *)(lVar46 + lVar54),pVVar30);
              lVar51 = lVar51 + 1;
              lVar54 = lVar54 + 0x58;
            } while (lVar51 < *(int *)((long)&(local_228->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x20));
          }
          pDVar40 = local_228;
          if (0 < *(int *)((long)&local_228->pool_ + 4)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pOVar32 = (pDVar40->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar33 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                  (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
                        (this,*(Edition *)
                               (*(long *)((long)&(pOVar32->name_scope).field_2 + lVar51) + 0x20),
                         pVVar33,(FieldDescriptor *)
                                 ((long)&(pOVar32->name_scope)._M_dataplus._M_p + lVar51),
                         *(OptionsType **)((long)&(pOVar32->element_name).field_2 + lVar51 + 8U),
                         (FlatAllocator *)&local_240->value,NAME,false);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((long)&pDVar40->pool_ + 4));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x24)) {
            local_1f0 = (DescriptorPool *)&(proto->field_0)._impl_.service_;
            pDVar45 = (DescriptorBuilder *)0x0;
            do {
              pSVar41 = (ServiceDescriptor *)
                        ((long)pDVar45 * 0x40 +
                        *(long *)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_engaged);
              local_220 = pDVar45;
              pVVar31 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                  ((RepeatedPtrFieldBase *)local_1f0,(int)pDVar45);
              ResolveFeaturesImpl<google::protobuf::ServiceDescriptor>
                        (this,pSVar41->file_->edition_,pVVar31,pSVar41,pSVar41->options_,
                         (FlatAllocator *)&local_240->value,NAME,false);
              if (0 < pSVar41->method_count_) {
                lVar54 = 0;
                lVar51 = 0;
                do {
                  pMVar6 = pSVar41->methods_;
                  pVVar34 = internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                      (&(pVVar31->field_0)._impl_.method_.super_RepeatedPtrFieldBase
                                       ,(int)lVar51);
                  ResolveFeaturesImpl<google::protobuf::MethodDescriptor>
                            (this,*(Edition *)
                                   (*(long *)(*(long *)((long)&pMVar6->service_ + lVar54) + 0x10) +
                                   0x20),pVVar34,
                             (MethodDescriptor *)(&pMVar6->super_SymbolBase + lVar54),
                             *(OptionsType **)((long)&pMVar6->options_ + lVar54),
                             (FlatAllocator *)&local_240->value,NAME,false);
                  lVar51 = lVar51 + 1;
                  lVar54 = lVar54 + 0x50;
                } while (lVar51 < pSVar41->method_count_);
              }
              pDVar45 = (DescriptorBuilder *)((SymbolBase *)&local_220->pool_ + 1);
              pDVar40 = local_228;
            } while ((long)pDVar45 <
                     (long)*(int *)((long)&(local_228->feature_resolver_).
                                           super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<google::protobuf::FeatureResolver>
                                           ._M_payload + 0x24));
          }
          pDVar40 = local_248;
          *(undefined1 *)(in_FS_OFFSET + -0x60) = local_231;
          local_208.first.ctrl_ = (ctrl_t *)this;
          if (0 < *(int *)((long)&(local_248->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x1c)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              lVar46 = *(long *)((long)&(pDVar40->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x40);
              pVVar28 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                  (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase
                                   ,(int)lVar54);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_4>>
              ::Visit<google::protobuf::DescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__4>>
                          *)&local_208,(Descriptor *)(lVar46 + lVar51),pVVar28);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0xa0;
            } while (lVar54 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x1c));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x20)) {
            lVar51 = 0;
            do {
              lVar54 = *(long *)((long)&(pDVar40->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x48);
              pVVar30 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                  (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                   (int)lVar51);
              if (0 < *(int *)(lVar54 + 4 + lVar51 * 0x58)) {
                iVar11 = 0;
                do {
                  internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                            (&(pVVar30->field_0)._impl_.value_.super_RepeatedPtrFieldBase,iVar11);
                  iVar11 = iVar11 + 1;
                } while (iVar11 < *(int *)(lVar54 + lVar51 * 0x58 + 4));
              }
              lVar51 = lVar51 + 1;
            } while (lVar51 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x20));
          }
          if (0 < *(int *)((long)&pDVar40->pool_ + 4)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pOVar32 = (pDVar40->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar33 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                  (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              PostProcessFieldFeatures
                        (this,(FieldDescriptor *)
                              ((long)&(pOVar32->name_scope)._M_dataplus._M_p + lVar51),pVVar33);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((long)&pDVar40->pool_ + 4));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x24)) {
            lVar51 = 0;
            do {
              lVar54 = *(long *)&(pDVar40->feature_resolver_).
                                 super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                 .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                 _M_engaged;
              pVVar31 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                  (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                                   (int)lVar51);
              if (0 < *(int *)(lVar54 + 0x38 + lVar51 * 0x40)) {
                iVar11 = 0;
                do {
                  internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                            (&(pVVar31->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar11);
                  iVar11 = iVar11 + 1;
                } while (iVar11 < *(int *)(lVar54 + lVar51 * 0x40 + 0x38));
              }
              lVar51 = lVar51 + 1;
            } while (lVar51 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x24));
          }
          pSVar50 = local_100;
          pOVar42 = (this->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pOVar55 = (this->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pOVar42 != pOVar55) {
            do {
              OptionInterpreter::InterpretOptionsImpl((OptionInterpreter *)local_1e0,pOVar42,false);
              pOVar42 = pOVar42 + 1;
              pOVar55 = (this->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            } while (pOVar42 != pOVar55);
          }
          pOVar42 = (this->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pOVar55 != pOVar42) {
            paVar52 = &(pOVar42->element_name).field_2;
            do {
              pvVar19 = (void *)paVar52[1]._M_allocated_capacity;
              if (pvVar19 != (void *)0x0) {
                operator_delete(pvVar19,paVar52[2]._M_allocated_capacity - (long)pvVar19);
              }
              plVar21 = (long *)(((string *)(paVar52 + -1))->_M_dataplus)._M_p;
              if (paVar52 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar21) {
                operator_delete(plVar21,paVar52->_M_allocated_capacity + 1);
              }
              if (paVar52 + -2 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar52[-3]._M_allocated_capacity) {
                operator_delete((long *)paVar52[-3]._M_allocated_capacity,
                                paVar52[-2]._M_allocated_capacity + 1);
              }
              pOVar53 = (OptionsToInterpret *)((long)paVar52 + 0x38);
              paVar52 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar52 + 0x68);
            } while (pOVar53 != pOVar55);
            (this->options_to_interpret_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
            ._M_impl.super__Vector_impl_data._M_finish = pOVar42;
          }
          if (pSVar50 != (SourceCodeInfo *)0x0) {
            OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)local_1e0,pSVar50);
          }
          DynamicMessageFactory::~DynamicMessageFactory(local_188);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::~raw_hash_set(&local_1a8);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::~raw_hash_set(&rStack_1c8);
        }
        pDVar40 = local_248;
        if ((this->had_errors_ == false) && (this->pool_->lazily_build_dependencies_ == false)) {
          local_1e0._0_8_ = this;
          ValidateOptions(this,(FileDescriptor *)local_248,proto);
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x1c)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              lVar46 = *(long *)((long)&(pDVar40->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x40);
              pVVar28 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                  (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase
                                   ,(int)lVar54);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
              ::Visit<google::protobuf::DescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
                          *)local_1e0,(Descriptor *)(lVar46 + lVar51),pVVar28);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0xa0;
            } while (lVar54 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x1c));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x20)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              lVar46 = *(long *)((long)&(pDVar40->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x48);
              pVVar30 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                  (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
              ::Visit<google::protobuf::EnumDescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
                          *)local_1e0,(EnumDescriptor *)(lVar46 + lVar51),pVVar30);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x20));
          }
          if (0 < *(int *)((long)&pDVar40->pool_ + 4)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pOVar32 = (pDVar40->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar33 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                  (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              ValidateOptions(this,(FieldDescriptor *)
                                   ((long)&(pOVar32->name_scope)._M_dataplus._M_p + lVar51),pVVar33)
              ;
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((long)&pDVar40->pool_ + 4));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x24)) {
            lVar51 = 0;
            do {
              pSVar41 = (ServiceDescriptor *)
                        (lVar51 * 0x40 +
                        *(long *)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_engaged);
              pVVar31 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                  (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                                   (int)lVar51);
              ValidateOptions(this,pSVar41,pVVar31);
              if (0 < pSVar41->method_count_) {
                iVar11 = 0;
                do {
                  internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                            (&(pVVar31->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar11);
                  iVar11 = iVar11 + 1;
                } while (iVar11 < pSVar41->method_count_);
              }
              lVar51 = lVar51 + 1;
            } while (lVar51 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x24));
          }
        }
        if ((this->had_errors_ == true) && (0 < *(int *)((long)&proto->field_0 + 0x28))) {
          lVar54 = 0;
          lVar51 = 0;
          do {
            pDVar40 = local_248;
            lVar46 = (long)*(int *)((long)&(local_248->feature_resolver_).
                                           super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<google::protobuf::FeatureResolver>
                                           ._M_payload + 0x1c);
            if (lVar51 < lVar46) {
              pcVar35 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar35 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (lVar51,lVar46,"index < message_type_count()");
            }
            if (pcVar35 != (Nonnull<const_char_*>)0x0) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)local_1e0,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xae7,pcVar35);
              goto LAB_00160996;
            }
            pDVar27 = *(Descriptor **)
                       ((long)&(pDVar40->feature_resolver_).
                               super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                               ._M_payload.
                               super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                               .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                               _M_payload._M_value.defaults_ + 0x40);
            pVVar28 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                                 (int)lVar51);
            DetectMapConflicts(this,(Descriptor *)(&pDVar27->super_SymbolBase + lVar54),pVVar28);
            lVar51 = lVar51 + 1;
            lVar54 = lVar54 + 0xa0;
          } while (lVar51 < *(int *)((long)&proto->field_0 + 0x28));
        }
        if (((this->had_errors_ == false) &&
            (absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::AssertNotDebugCapacity
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         *)local_1e8),
            1 < (this->unused_dependency_).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_)) && (this->pool_->lazily_build_dependencies_ == false)) {
          LogUnusedDependency(this,proto,result_00);
        }
        pDVar40 = local_248;
        if ((this->had_errors_ == false) && (this->pool_->lazily_build_dependencies_ == false)) {
          pOVar32 = (local_248->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_218 = this;
          local_210 = proto;
          if (pOVar32 != (pointer)_FeatureSet_default_instance_) {
            rStack_1c8.settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_ = (size_t)(local_248->tables_->pending_files_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
            local_1d0.value =
                 (PointerT<google::protobuf::SourceCodeInfo>)
                 (local_248->tables_->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            puVar16 = (undefined8 *)
                      ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
            rStack_1c8.settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.control = (ctrl_t *)*puVar16;
            rStack_1c8.settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_ = puVar16[1];
            local_1e0._8_8_ = proto;
            local_1e0._0_8_ = pOVar32;
            local_230 = local_248;
            absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
            ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                      (&local_208,&this->deferred_validation_->lifetimes_info_map_,
                       (FileDescriptor **)&local_230);
            iVar7._M_current = *(LifetimesInfo **)((long)local_208.first.field_1.slot_ + 0x10);
            if (iVar7._M_current == *(LifetimesInfo **)((long)local_208.first.field_1.slot_ + 0x18))
            {
              std::
              vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
              ::
              _M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                        ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                          *)((long)local_208.first.field_1.slot_ + 8),iVar7,
                         (LifetimesInfo *)local_1e0);
            }
            else {
              ((iVar7._M_current)->filename)._M_len =
                   rStack_1c8.settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
              ((iVar7._M_current)->filename)._M_str =
                   rStack_1c8.settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
              ((iVar7._M_current)->full_name)._M_len = (size_t)local_1d0.value;
              ((iVar7._M_current)->full_name)._M_str =
                   (char *)rStack_1c8.settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.capacity_;
              (iVar7._M_current)->proto_features = (FeatureSet *)local_1e0._0_8_;
              (iVar7._M_current)->proto = (Message *)local_1e0._8_8_;
              *(long *)((long)local_208.first.field_1.slot_ + 0x10) =
                   *(long *)((long)local_208.first.field_1.slot_ + 0x10) + 0x30;
            }
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x1c)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pDVar27 = *(Descriptor **)
                         ((long)&(pDVar40->feature_resolver_).
                                 super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                 .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                 _M_payload._M_value.defaults_ + 0x40);
              pVVar28 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                  (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase
                                   ,(int)lVar54);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
              ::Visit<google::protobuf::DescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                          *)&local_218,(Descriptor *)(&pDVar27->super_SymbolBase + lVar51),pVVar28);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0xa0;
            } while (lVar54 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x1c));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x20)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pEVar29 = *(EnumDescriptor **)
                         ((long)&(pDVar40->feature_resolver_).
                                 super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                 .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                 _M_payload._M_value.defaults_ + 0x48);
              pVVar30 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                  (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
              ::Visit<google::protobuf::EnumDescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                          *)&local_218,(EnumDescriptor *)(&pEVar29->super_SymbolBase + lVar51),
                         pVVar30);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x20));
          }
          if (0 < *(int *)((SymbolBase *)&pDVar40->pool_ + 4)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pOVar32 = (pDVar40->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar33 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                  (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
              ::Visit<google::protobuf::FieldDescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                          *)&local_218,
                         (FieldDescriptor *)((long)&(pOVar32->name_scope)._M_dataplus._M_p + lVar51)
                         ,pVVar33);
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((SymbolBase *)&pDVar40->pool_ + 4));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x24)) {
            local_228 = (DescriptorBuilder *)&(proto->field_0)._impl_.service_;
            psVar43 = (slot_type *)0x0;
            local_220 = pDVar40;
            do {
              pSVar41 = *(ServiceDescriptor **)
                         &(local_220->feature_resolver_).
                          super__Optional_base<google::protobuf::FeatureResolver,_false,_false>.
                          _M_payload.
                          super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                          .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                          _M_engaged;
              aVar36.slot_ = (slot_type *)
                             internal::RepeatedPtrFieldBase::
                             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                       ((RepeatedPtrFieldBase *)local_228,(int)psVar43);
              if (pSVar41[(long)psVar43].proto_features_ !=
                  (FeatureSet *)_FeatureSet_default_instance_) {
                pcVar47 = pSVar41[(long)psVar43].all_names_.payload_;
                local_230 = (DescriptorBuilder *)pSVar41[(long)psVar43].file_;
                local_1d0.value =
                     (PointerT<google::protobuf::SourceCodeInfo>)(ulong)*(ushort *)(pcVar47 + 2);
                puVar16 = (undefined8 *)
                          ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc);
                rStack_1c8.settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.control = (ctrl_t *)*puVar16;
                rStack_1c8.settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ = puVar16[1];
                local_1e0._8_8_ = aVar36.slot_;
                local_1e0._0_8_ = pSVar41[(long)psVar43].proto_features_;
                rStack_1c8.settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_ = (size_t)(pcVar47 + ~(ulong)local_1d0.value);
                absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                          (&local_208,&this->deferred_validation_->lifetimes_info_map_,
                           (FileDescriptor **)&local_230);
                iVar7._M_current = *(LifetimesInfo **)((long)local_208.first.field_1.slot_ + 0x10);
                if (iVar7._M_current ==
                    *(LifetimesInfo **)((long)local_208.first.field_1.slot_ + 0x18)) {
                  std::
                  vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                  ::
                  _M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                            ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                              *)((long)local_208.first.field_1.slot_ + 8),iVar7,
                             (LifetimesInfo *)local_1e0);
                }
                else {
                  ((iVar7._M_current)->filename)._M_len =
                       rStack_1c8.settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.size_;
                  ((iVar7._M_current)->filename)._M_str =
                       rStack_1c8.settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.heap.control;
                  ((iVar7._M_current)->full_name)._M_len = (size_t)local_1d0.value;
                  ((iVar7._M_current)->full_name)._M_str =
                       (char *)rStack_1c8.settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.capacity_;
                  (iVar7._M_current)->proto_features = (FeatureSet *)local_1e0._0_8_;
                  (iVar7._M_current)->proto = (Message *)local_1e0._8_8_;
                  *(long *)((long)local_208.first.field_1.slot_ + 0x10) =
                       *(long *)((long)local_208.first.field_1.slot_ + 0x10) + 0x30;
                }
              }
              local_240 = psVar43;
              if (0 < pSVar41[(long)psVar43].method_count_) {
                lVar54 = 8;
                lVar51 = 0;
                do {
                  pMVar6 = pSVar41[(long)psVar43].methods_;
                  aVar37.slot_ = (slot_type *)
                                 internal::RepeatedPtrFieldBase::
                                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                           ((RepeatedPtrFieldBase *)((long)aVar36.slot_ + 0x18),
                                            (int)lVar51);
                  pcVar8 = *(ctrl_t **)((long)&pMVar6->options_ + lVar54);
                  if (pcVar8 != _FeatureSet_default_instance_) {
                    local_230 = *(DescriptorBuilder **)
                                 (*(long *)((long)&(pMVar6->all_names_).payload_ + lVar54) + 0x10);
                    local_1d0.value =
                         (PointerT<google::protobuf::SourceCodeInfo>)
                         (ulong)*(ushort *)(*(long *)(&pMVar6->super_SymbolBase + lVar54) + 2);
                    puVar16 = (undefined8 *)
                              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc);
                    rStack_1c8.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control = (ctrl_t *)*puVar16;
                    rStack_1c8.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.size_ = puVar16[1];
                    local_1e0._8_8_ = aVar37.slot_;
                    local_1e0._0_8_ = pcVar8;
                    rStack_1c8.settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_ =
                         ~(ulong)local_1d0.value + *(long *)(&pMVar6->super_SymbolBase + lVar54);
                    absl::lts_20250127::container_internal::
                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                    ::try_emplace_impl<google::protobuf::FileDescriptor_const*const&>
                              (&local_208,&this->deferred_validation_->lifetimes_info_map_,
                               (FileDescriptor **)&local_230);
                    iVar7._M_current =
                         *(LifetimesInfo **)((long)local_208.first.field_1.slot_ + 0x10);
                    if (iVar7._M_current ==
                        *(LifetimesInfo **)((long)local_208.first.field_1.slot_ + 0x18)) {
                      std::
                      vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                      ::
                      _M_realloc_insert<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                                ((vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                                  *)((long)local_208.first.field_1.slot_ + 8),iVar7,
                                 (LifetimesInfo *)local_1e0);
                    }
                    else {
                      ((iVar7._M_current)->filename)._M_len =
                           rStack_1c8.settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.size_;
                      ((iVar7._M_current)->filename)._M_str =
                           rStack_1c8.settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.control;
                      ((iVar7._M_current)->full_name)._M_len = (size_t)local_1d0.value;
                      ((iVar7._M_current)->full_name)._M_str =
                           (char *)rStack_1c8.settings_.
                                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                   .value.capacity_;
                      (iVar7._M_current)->proto_features = (FeatureSet *)local_1e0._0_8_;
                      (iVar7._M_current)->proto = (Message *)local_1e0._8_8_;
                      *(long *)((long)local_208.first.field_1.slot_ + 0x10) =
                           *(long *)((long)local_208.first.field_1.slot_ + 0x10) + 0x30;
                    }
                  }
                  lVar51 = lVar51 + 1;
                  lVar54 = lVar54 + 0x50;
                } while (lVar51 < pSVar41[(long)psVar43].method_count_);
              }
              psVar43 = (slot_type *)((long)local_240 + 1);
            } while ((long)psVar43 <
                     (long)*(int *)((long)&(local_220->feature_resolver_).
                                           super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<google::protobuf::FeatureResolver>
                                           ._M_payload + 0x24));
          }
        }
        pDVar40 = local_248;
        if ((this->had_errors_ == false) && (this->pool_->enforce_naming_style_ == true)) {
          local_1e0._0_8_ = this;
          if (*(int *)(*(long *)&local_248->had_errors_ + 0x48) == 1) {
            ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
                      (this,(FileDescriptor *)local_248,proto);
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x1c)) {
            lVar54 = 0;
            lVar51 = 0;
            do {
              lVar46 = *(long *)((long)&(pDVar40->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x40);
              pVVar28 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                  (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase
                                   ,(int)lVar51);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
              ::Visit<google::protobuf::DescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                          *)local_1e0,(Descriptor *)(lVar46 + lVar54),pVVar28);
              lVar51 = lVar51 + 1;
              lVar54 = lVar54 + 0xa0;
            } while (lVar51 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x1c));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x20)) {
            lVar54 = 0;
            lVar51 = 0;
            do {
              lVar46 = *(long *)((long)&(pDVar40->feature_resolver_).
                                        super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<google::protobuf::FeatureResolver>
                                        ._M_payload._M_value.defaults_ + 0x48);
              pVVar30 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                  (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                                   (int)lVar51);
              internal::
              VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
              ::Visit<google::protobuf::EnumDescriptorProto_const>
                        ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                          *)local_1e0,(EnumDescriptor *)(lVar46 + lVar54),pVVar30);
              lVar51 = lVar51 + 1;
              lVar54 = lVar54 + 0x58;
            } while (lVar51 < *(int *)((long)&(pDVar40->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x20));
          }
          if (0 < *(int *)((long)&pDVar40->pool_ + 4)) {
            lVar51 = 0;
            lVar54 = 0;
            do {
              pOVar32 = (pDVar40->options_to_interpret_).
                        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pVVar33 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                  (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                                   (int)lVar54);
              if (*(int *)(*(long *)((long)&(pOVar32->element_path).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    lVar51 + 8) + 0x48) == 1) {
                ValidateNamingStyle<google::protobuf::FieldDescriptor,google::protobuf::FieldDescriptorProto>
                          (this,(FieldDescriptor *)
                                ((long)&(pOVar32->name_scope)._M_dataplus._M_p + lVar51),pVVar33);
              }
              lVar54 = lVar54 + 1;
              lVar51 = lVar51 + 0x58;
            } while (lVar54 < *(int *)((long)&pDVar40->pool_ + 4));
          }
          if (0 < *(int *)((long)&(pDVar40->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_payload + 0x24)) {
            local_240 = (slot_type *)&(proto->field_0)._impl_.service_;
            lVar51 = 0;
            local_228 = pDVar40;
            do {
              pSVar41 = (ServiceDescriptor *)
                        (lVar51 * 0x40 +
                        *(long *)&(local_228->feature_resolver_).
                                  super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                  .super__Optional_payload_base<google::protobuf::FeatureResolver>.
                                  _M_engaged);
              pVVar31 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                  ((RepeatedPtrFieldBase *)&local_240->value,(int)lVar51);
              if ((pSVar41->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
                ValidateNamingStyle<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
                          (this,pSVar41,pVVar31);
              }
              if (0 < pSVar41->method_count_) {
                lVar46 = 0;
                lVar54 = 0;
                do {
                  pMVar6 = pSVar41->methods_;
                  pVVar34 = internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                      (&(pVVar31->field_0)._impl_.method_.super_RepeatedPtrFieldBase
                                       ,(int)lVar54);
                  if (*(int *)(*(long *)((long)&pMVar6->merged_features_ + lVar46) + 0x48) == 1) {
                    ValidateNamingStyle<google::protobuf::MethodDescriptor,google::protobuf::MethodDescriptorProto>
                              (this,(MethodDescriptor *)(&pMVar6->super_SymbolBase + lVar46),pVVar34
                              );
                  }
                  lVar54 = lVar54 + 1;
                  lVar46 = lVar46 + 0x50;
                } while (lVar54 < pSVar41->method_count_);
              }
              lVar51 = lVar51 + 1;
            } while (lVar51 < *(int *)((long)&(local_228->feature_resolver_).
                                              super__Optional_base<google::protobuf::FeatureResolver,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<google::protobuf::FeatureResolver,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<google::protobuf::FeatureResolver>
                                              ._M_payload + 0x24));
          }
        }
        if (this->had_errors_ == false) {
          CheckVisibilityRules(this,(FileDescriptor *)local_248,proto);
        }
        pDVar40 = local_248;
        if (this->had_errors_ != false) goto LAB_00160893;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)local_c8);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_a8);
      goto LAB_001608af;
    }
    plVar21 = (long *)((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar47 = (char *)*plVar21;
    sVar44 = plVar21[1];
    error = "A file with this name is already in the pool.";
    location = OTHER;
LAB_0015f143:
    element_name_02._M_str = pcVar47;
    element_name_02._M_len = sVar44;
    AddError(this,element_name_02,&proto->super_Message,location,error);
  }
  else {
    __s = (local_248->tables_->pending_files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pvVar19 = memchr(__s,0,(size_t)__n_00);
    if ((long)pvVar19 - (long)__s == -1 || pvVar19 == (void *)0x0) goto LAB_0015f0c5;
    local_f8 = local_1e0;
    local_1e0._0_8_ = &local_248;
    pcStack_f0 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_01.invoker_._0_4_ = 0x175758;
    make_error_01.ptr_.obj = local_f8;
    make_error_01.invoker_._4_4_ = 0;
    element_name_01._M_str = (char *)__s;
    element_name_01._M_len = (size_t)__n_00;
    AddError(this,element_name_01,&proto->super_Message,NAME,make_error_01);
  }
  pDVar40 = (DescriptorBuilder *)0x0;
LAB_001608af:
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData(&local_88);
  return (FileDescriptor *)pDVar40;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto, internal::FlatAllocator& alloc) {
  FileDescriptor* result = alloc.AllocateArray<FileDescriptor>(1);
  file_ = result;

  if (proto.has_edition()) {
    file_->edition_ = proto.edition();
  } else if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->edition_ = Edition::EDITION_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->edition_ = Edition::EDITION_PROTO3;
  } else {
    file_->edition_ = Edition::EDITION_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER, [&] {
      return absl::StrCat("Unrecognized syntax: ", proto.syntax());
    });
  }

  const FeatureSetDefaults& defaults = pool_->GetFeatureSetDefaults();

  absl::StatusOr<FeatureResolver> feature_resolver =
      FeatureResolver::Create(file_->edition_, defaults);
  if (!feature_resolver.ok()) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::EDITIONS,
             [&] { return std::string(feature_resolver.status().message()); });
  } else {
    feature_resolver_.emplace(std::move(feature_resolver).value());
  }

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = alloc.AllocateArray<SourceCodeInfo>(1);
    *info = proto.source_code_info();
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = alloc.AllocateArray<FileDescriptorTables>(1);
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = alloc.AllocateStrings(proto.name());
  if (proto.has_package()) {
    result->package_ = alloc.AllocateStrings(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = alloc.AllocateStrings("");
  }
  result->pool_ = pool_;

  if (absl::StrContains(result->name(), '\0')) {
    AddError(result->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", result->name(), "\" contains null character.");
    });
    return nullptr;
  }

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    if (std::count(result->package().begin(), result->package().end(), '.') >
        kPackageLimit) {
      AddError(result->package(), proto, DescriptorPool::ErrorCollector::NAME,
               "Exceeds Maximum Package Depth");
      return nullptr;
    }
    AddPackage(result->package(), proto, result, true);
  }

  // Make sure all dependencies are loaded.
  absl::flat_hash_set<absl::string_view> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      alloc.AllocateArray<const FileDescriptor*>(proto.dependency_size());
  result->dependencies_once_ = nullptr;
  unused_dependency_.clear();
  absl::flat_hash_set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }

  bool need_lazy_deps = false;
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.contains(i))) {
          internal::FlatAllocator lazy_dep_alloc;
          lazy_dep_alloc.PlanArray<FileDescriptor>(1);
          lazy_dep_alloc.PlanArray<std::string>(1);
          lazy_dep_alloc.FinalizePlanning(tables_);
          dependency = pool_->NewPlaceholderFileWithMutexHeld(
              proto.dependency(i), lazy_dep_alloc);
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->direct_input_files_.find(proto.name()) !=
           pool_->direct_input_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      need_lazy_deps = true;
    }
  }
  if (need_lazy_deps) {
    int total_char_size = 0;
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        total_char_size += static_cast<int>(proto.dependency(i).size());
      }
      ++total_char_size;  // For NUL char
    }

    void* data = tables_->AllocateBytes(
        static_cast<int>(sizeof(absl::once_flag)) + total_char_size);
    result->dependencies_once_ = ::new (data) absl::once_flag{};
    char* name_data = reinterpret_cast<char*>(result->dependencies_once_ + 1);

    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        memcpy(name_data, proto.dependency(i).data(),
               proto.dependency(i).size());
        name_data += proto.dependency(i).size();
      }
      *name_data++ = '\0';
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      alloc.AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      alloc.AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  AllocateOptions(proto, result, alloc);

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  if (!message_hints_.empty()) {
    SuggestFieldNumbers(result, proto);
  }

  // Interpret only the non-extension options first, including features and
  // their extensions.  This has to be done in two passes, since option
  // extensions defined in this file may have features attached to them.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretNonExtensionOptions(&(*iter));
    }

    // Handle feature resolution.  This must occur after option interpretation,
    // but before validation.
    {
      auto cleanup = DisableTracking();
      internal::VisitDescriptors(
          *result, proto, [&](const auto& descriptor, const auto& proto) {
            using OptionsT =
                typename std::remove_const<typename std::remove_pointer<
                    decltype(descriptor.options_)>::type>::type;
            using DescriptorT =
                typename std::remove_const<typename std::remove_reference<
                    decltype(descriptor)>::type>::type;

            ResolveFeatures(
                proto, const_cast<DescriptorT*>(&descriptor),
                const_cast<  // NOLINT(google3-runtime-proto-const-cast)
                    OptionsT*>(descriptor.options_),
                alloc);
          });
    }

    // Post-process cleanup for field features.
    internal::VisitDescriptors(
        *result, proto,
        [&](const FieldDescriptor& field, const FieldDescriptorProto& proto) {
          PostProcessFieldFeatures(const_cast<FieldDescriptor&>(field), proto);
        });

    // Interpret any remaining uninterpreted options gathered into
    // options_to_interpret_ during descriptor building.  Cross-linking has made
    // extension options known, so all interpretations should now succeed.
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptionExtensions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          ValidateOptions(&descriptor, desc_proto);
        });
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking. Also, don't log unused dependencies if there were previous
  // errors, since the results might be inaccurate.
  if (!had_errors_ && !unused_dependency_.empty() &&
      !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  // Store feature information for deferred validation outside of the database
  // mutex.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (descriptor.proto_features_ != &FeatureSet::default_instance()) {
            deferred_validation_.ValidateFeatureLifetimes(
                GetFile(descriptor), {descriptor.proto_features_, &desc_proto,
                                      GetFullName(descriptor), proto.name()});
          }
        });
  }

  if (!had_errors_ && pool_->enforce_naming_style_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (internal::InternalFeatureHelper::GetFeatures(descriptor)
                  .enforce_naming_style() == FeatureSet::STYLE2024) {
            ValidateNamingStyle(&descriptor, desc_proto);
          }
        });
  }
  if (!had_errors_) {
    // Check Symbol Visibility Rules.
    CheckVisibilityRules(result, proto);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}